

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool __thiscall
tinyusdz::tydra::GetRelationshipNames
          (tydra *this,Prim *prim,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *out_rel_names,string *err)

{
  bool bVar1;
  int iVar2;
  Model *model;
  undefined7 extraout_var;
  ostream *poVar3;
  Xform *xform;
  undefined7 extraout_var_00;
  Scope *scope;
  undefined7 extraout_var_01;
  GeomMesh *mesh;
  undefined7 extraout_var_02;
  undefined1 rel_prop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ostringstream ss_e;
  allocator local_201;
  string local_200;
  string local_1e0;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  rel_prop = SUB81(err,0);
  if (*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) {
LAB_00277786:
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"GetRelationshipNames");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7df);
    ::std::operator<<(poVar3," ");
    poVar3 = ::std::operator<<((ostream *)local_1a0,"TODO: Prim type ");
    linb::any::type_name_abi_cxx11_((string *)&local_200,(any *)(this + 0x298));
    poVar3 = ::std::operator<<(poVar3,(string *)&local_200);
    ::std::operator<<(poVar3,"\n");
  }
  else {
    iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))();
    if (iVar2 == 0x401) {
      model = Prim::as<tinyusdz::Model>((Prim *)this);
      bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::Model>
                        (model,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)prim,false,(bool)rel_prop);
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT71(extraout_var,bVar1) & 0xffffffff);
      if ((char)args != '\0') {
        return true;
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a0);
      poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"GetRelationshipNames");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7d3);
      ::std::operator<<(poVar3," ");
      ::std::__cxx11::string::string
                (local_1c0,"Failed to list up Property names of Prim type {}",&local_201);
      tinyusdz::value::TypeTraits<tinyusdz::Model>::type_name_abi_cxx11_();
    }
    else {
      if (*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) goto LAB_00277786;
      iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))();
      if (iVar2 == 0x404) {
        xform = Prim::as<tinyusdz::Xform>((Prim *)this);
        bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::Xform>
                          (xform,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)prim,false,(bool)rel_prop);
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (CONCAT71(extraout_var_00,bVar1) & 0xffffffff);
        if ((char)args != '\0') {
          return true;
        }
        ::std::__cxx11::ostringstream::ostringstream(local_1a0);
        poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"GetRelationshipNames");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7d4);
        ::std::operator<<(poVar3," ");
        ::std::__cxx11::string::string
                  (local_1c0,"Failed to list up Property names of Prim type {}",&local_201);
        tinyusdz::value::TypeTraits<tinyusdz::Xform>::type_name_abi_cxx11_();
      }
      else {
        if (*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) goto LAB_00277786;
        iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))();
        if (iVar2 == 0x402) {
          scope = Prim::as<tinyusdz::Scope>((Prim *)this);
          bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::Scope>
                            (scope,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)prim,false,(bool)rel_prop);
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (CONCAT71(extraout_var_01,bVar1) & 0xffffffff);
          if ((char)args != '\0') {
            return true;
          }
          ::std::__cxx11::ostringstream::ostringstream(local_1a0);
          poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"GetRelationshipNames");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7d5);
          ::std::operator<<(poVar3," ");
          ::std::__cxx11::string::string
                    (local_1c0,"Failed to list up Property names of Prim type {}",&local_201);
          tinyusdz::value::TypeTraits<tinyusdz::Scope>::type_name_abi_cxx11_();
        }
        else {
          if ((*(undefined8 **)(this + 0x2a8) == (undefined8 *)0x0) ||
             (iVar2 = (*(code *)**(undefined8 **)(this + 0x2a8))(), iVar2 != 0x405))
          goto LAB_00277786;
          mesh = Prim::as<tinyusdz::GeomMesh>((Prim *)this);
          bVar1 = anon_unknown_6::GetPrimPropertyNamesImpl<tinyusdz::GeomMesh>
                            (mesh,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)prim,false,(bool)rel_prop);
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (CONCAT71(extraout_var_02,bVar1) & 0xffffffff);
          if ((char)args != '\0') {
            return true;
          }
          ::std::__cxx11::ostringstream::ostringstream(local_1a0);
          poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"GetRelationshipNames");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0x7d6);
          ::std::operator<<(poVar3," ");
          ::std::__cxx11::string::string
                    (local_1c0,"Failed to list up Property names of Prim type {}",&local_201);
          tinyusdz::value::TypeTraits<tinyusdz::GeomMesh>::type_name_abi_cxx11_();
        }
      }
    }
    fmt::format<std::__cxx11::string>(&local_200,(fmt *)local_1c0,&local_1e0,args);
    poVar3 = ::std::operator<<((ostream *)local_1a0,(string *)&local_200);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::string::_M_dispose();
  if (out_rel_names !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)out_rel_names);
    ::std::__cxx11::string::_M_dispose();
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return false;
}

Assistant:

bool GetRelationshipNames(const tinyusdz::Prim &prim,
                          std::vector<std::string> *out_rel_names,
                          std::string *err) {
#define GET_PRIM_RELATIONSHIP_NAMES(__ty)                                 \
  if (prim.is<__ty>()) {                                                  \
    auto ret = GetPrimPropertyNamesImpl(*prim.as<__ty>(), out_rel_names,  \
                                        false, true);                     \
    if (!ret) {                                                           \
      PUSH_ERROR_AND_RETURN(                                              \
          fmt::format("Failed to list up Property names of Prim type {}", \
                      value::TypeTraits<__ty>::type_name()));             \
    }                                                                     \
  } else

  GET_PRIM_RELATIONSHIP_NAMES(Model)
  GET_PRIM_RELATIONSHIP_NAMES(Xform)
  GET_PRIM_RELATIONSHIP_NAMES(Scope)
  GET_PRIM_RELATIONSHIP_NAMES(GeomMesh)
  // GET_PRIM_RELATIONSHIP_NAMES(GeomSubset)
  // GET_PRIM_RELATIONSHIP_NAMES(Shader)
  // GET_PRIM_RELATIONSHIP_NAMES(Material)
  // GET_PRIM_RELATIONSHIP_NAMES(SkelRoot)
  // GET_PRIM_RELATIONSHIP_NAMES(BlendShape)
  // GET_PRIM_RELATIONSHIP_NAMES(Skeleton)
  // GET_PRIM_RELATIONSHIP_NAMES(SkelAnimation)
  {
    PUSH_ERROR_AND_RETURN("TODO: Prim type " << prim.type_name());
  }

#undef GET_PRIM_PROPERTY_NAMES

  return true;
}